

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressBlock_greedy_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  BYTE *pBVar2;
  undefined8 *puVar3;
  uint uVar4;
  char cVar5;
  undefined8 uVar6;
  U32 lowestValid;
  uint uVar7;
  seqDef *psVar8;
  uint uVar9;
  ulong *puVar10;
  ulong *puVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  BYTE *pInLoopLimit;
  ulong *puVar15;
  BYTE *pBVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  ulong *puVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  ulong *puVar24;
  U32 UVar25;
  U32 UVar26;
  ulong uVar27;
  size_t sVar28;
  BYTE *litEnd_1;
  ulong uVar29;
  BYTE *litEnd;
  ulong *puVar30;
  size_t offbaseFound;
  BYTE *litLimit_w;
  size_t local_a0;
  ulong *local_98;
  ulong *local_90;
  BYTE *local_88;
  uint local_7c;
  ulong *local_78;
  uint local_6c;
  ulong local_68;
  uint local_60;
  uint local_5c;
  uint local_58;
  int local_54;
  uint *local_50;
  BYTE *local_48;
  ulong *local_40;
  ulong *local_38;
  
  local_88 = (ms->window).base;
  uVar7 = (ms->window).dictLimit;
  local_48 = local_88 + uVar7;
  local_7c = (ms->cParams).minMatch;
  if (5 < local_7c) {
    local_7c = 6;
  }
  if (local_7c < 5) {
    local_7c = 4;
  }
  local_6c = (ms->cParams).searchLog;
  uVar13 = 6;
  if (local_6c < 6) {
    uVar13 = local_6c;
  }
  if (uVar13 < 5) {
    uVar13 = 4;
  }
  puVar15 = (ulong *)((ulong)((int)src == (int)local_48) + (long)src);
  uVar21 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar14 = (int)puVar15 - (int)local_88;
  local_5c = *rep;
  local_58 = iVar14 - uVar21;
  if (iVar14 - uVar7 <= uVar21) {
    local_58 = uVar7;
  }
  uVar21 = 0;
  if (ms->loadedDictEnd != 0) {
    local_58 = uVar7;
  }
  local_60 = rep[1];
  local_58 = iVar14 - local_58;
  uVar7 = local_60;
  if (local_58 < local_60) {
    uVar7 = uVar21;
  }
  uVar9 = local_5c;
  if (local_58 < local_5c) {
    uVar9 = uVar21;
  }
  uVar29 = (ulong)uVar9;
  ms->lazySkipping = 0;
  local_78 = (ulong *)((long)src + (srcSize - 0x10));
  uVar4 = ms->nextToUpdate;
  uVar18 = (ulong)uVar4;
  uVar19 = ((int)local_78 - (int)(local_88 + uVar18)) + 1;
  uVar23 = 8;
  if (uVar19 < 8) {
    uVar23 = uVar19;
  }
  if (local_78 < local_88 + uVar18) {
    uVar23 = uVar21;
  }
  if (uVar4 < uVar23 + uVar4) {
    uVar22 = ms->hashSalt;
    cVar5 = (char)ms->rowHashLog;
    do {
      if (local_7c == 5) {
        uVar27 = *(long *)(local_88 + uVar18) * -0x30e4432345000000;
LAB_01d31a97:
        UVar25 = (U32)((uVar27 ^ uVar22) >> (0x38U - cVar5 & 0x3f));
      }
      else {
        if (local_7c == 6) {
          uVar27 = *(long *)(local_88 + uVar18) * -0x30e4432340650000;
          goto LAB_01d31a97;
        }
        UVar25 = (*(int *)(local_88 + uVar18) * -0x61c8864f ^ (uint)uVar22) >>
                 (0x18U - cVar5 & 0x1f);
      }
      ms->hashCache[(uint)uVar18 & 7] = UVar25;
      uVar18 = uVar18 + 1;
    } while (uVar23 + uVar4 != uVar18);
  }
  puVar24 = (ulong *)(srcSize + (long)src);
  local_50 = rep;
  if (puVar15 < local_78) {
    puVar1 = (ulong *)((long)puVar24 - 7);
    local_38 = (ulong *)((long)puVar24 + -3);
    local_40 = (ulong *)((long)puVar24 + -1);
    puVar20 = puVar24 + -4;
    local_98 = puVar20;
    local_90 = puVar24;
    do {
      uVar21 = (uint)uVar29;
      if ((uVar21 == 0) || (*(int *)(((long)puVar15 + 1) - uVar29) != *(int *)((long)puVar15 + 1)))
      {
        local_a0 = 999999999;
        if (local_7c == 6) {
          if (uVar13 == 6) {
            uVar18 = ZSTD_RowFindBestMatch_noDict_6_6(ms,(BYTE *)puVar15,(BYTE *)puVar24,&local_a0);
          }
          else if (uVar13 == 5) {
            uVar18 = ZSTD_RowFindBestMatch_noDict_6_5(ms,(BYTE *)puVar15,(BYTE *)puVar24,&local_a0);
          }
          else {
            uVar18 = ZSTD_RowFindBestMatch_noDict_6_4(ms,(BYTE *)puVar15,(BYTE *)puVar24,&local_a0);
          }
        }
        else if (local_7c == 5) {
          if (uVar13 == 6) {
            uVar18 = ZSTD_RowFindBestMatch_noDict_5_6(ms,(BYTE *)puVar15,(BYTE *)puVar24,&local_a0);
          }
          else if (uVar13 == 5) {
            uVar18 = ZSTD_RowFindBestMatch_noDict_5_5(ms,(BYTE *)puVar15,(BYTE *)puVar24,&local_a0);
          }
          else {
            uVar18 = ZSTD_RowFindBestMatch_noDict_5_4(ms,(BYTE *)puVar15,(BYTE *)puVar24,&local_a0);
          }
        }
        else if (uVar13 == 6) {
          uVar18 = ZSTD_RowFindBestMatch_noDict_4_6(ms,(BYTE *)puVar15,(BYTE *)puVar24,&local_a0);
        }
        else if (uVar13 == 5) {
          uVar18 = ZSTD_RowFindBestMatch_noDict_4_5(ms,(BYTE *)puVar15,(BYTE *)puVar24,&local_a0);
        }
        else {
          uVar18 = ZSTD_RowFindBestMatch_noDict_4_4(ms,(BYTE *)puVar15,(BYTE *)puVar24,&local_a0);
        }
        sVar28 = local_a0;
        if (uVar18 == 0) {
          sVar28 = 1;
        }
        UVar25 = (U32)sVar28;
        puVar20 = local_98;
        puVar24 = local_90;
        if (3 < uVar18) {
          if (3 < local_a0) {
            if ((src < puVar15) && (local_48 < (BYTE *)((long)puVar15 + (3 - local_a0)))) {
              puVar30 = puVar15;
              while (puVar15 = puVar30,
                    *(char *)((long)puVar30 - 1) == *(char *)((long)puVar30 + (2 - local_a0))) {
                puVar15 = (ulong *)((long)puVar30 - 1);
                uVar18 = uVar18 + 1;
                if ((puVar15 <= src) ||
                   (pBVar16 = (BYTE *)((long)puVar30 + (2 - local_a0)), puVar30 = puVar15,
                   pBVar16 <= local_48)) break;
              }
            }
            uVar29 = (ulong)(UVar25 - 3);
            uVar7 = uVar21;
          }
          goto LAB_01d31d11;
        }
        ms->lazySkipping = (uint)(0x7ff < (ulong)((long)puVar15 - (long)src));
        puVar15 = (ulong *)((long)puVar15 + ((ulong)((long)puVar15 - (long)src) >> 8) + 1);
      }
      else {
        lVar12 = -uVar29;
        puVar30 = (ulong *)((long)puVar15 + 5);
        puVar10 = (ulong *)((long)puVar15 + lVar12 + 5);
        puVar11 = puVar30;
        if (puVar30 < puVar1) {
          if (*puVar10 == *puVar30) {
            lVar17 = 0;
            do {
              puVar11 = (ulong *)((long)puVar15 + lVar17 + 0xd);
              puVar20 = local_98;
              if (puVar1 <= puVar11) {
                puVar10 = (ulong *)((long)puVar15 + lVar12 + lVar17 + 0xd);
                puVar11 = (ulong *)((long)puVar15 + lVar17 + 0xd);
                goto LAB_01d31cc4;
              }
              uVar18 = *(ulong *)((long)puVar15 + lVar17 + lVar12 + 0xd);
              uVar22 = *puVar11;
              lVar17 = lVar17 + 8;
            } while (uVar18 == uVar22);
            uVar22 = uVar22 ^ uVar18;
            uVar18 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
            uVar18 = (uVar18 >> 3 & 0x1fffffff) + lVar17;
          }
          else {
            uVar22 = *puVar30 ^ *puVar10;
            uVar18 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
            uVar18 = uVar18 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_01d31cc4:
          if ((puVar11 < local_38) && ((int)*puVar10 == (int)*puVar11)) {
            puVar11 = (ulong *)((long)puVar11 + 4);
            puVar10 = (ulong *)((long)puVar10 + 4);
          }
          if ((puVar11 < local_40) && ((short)*puVar10 == (short)*puVar11)) {
            puVar11 = (ulong *)((long)puVar11 + 2);
            puVar10 = (ulong *)((long)puVar10 + 2);
          }
          if (puVar11 < puVar24) {
            puVar11 = (ulong *)((long)puVar11 + (ulong)((char)*puVar10 == (char)*puVar11));
          }
          uVar18 = (long)puVar11 - (long)puVar30;
        }
        uVar18 = uVar18 + 4;
        UVar25 = 1;
        puVar15 = (ulong *)((long)puVar15 + 1);
LAB_01d31d11:
        uVar22 = (long)puVar15 - (long)src;
        puVar30 = (ulong *)seqStore->lit;
        local_68 = uVar18;
        if (puVar20 < puVar15) {
          ZSTD_safecopyLiterals((BYTE *)puVar30,(BYTE *)src,(BYTE *)puVar15,(BYTE *)puVar20);
LAB_01d31d3f:
          seqStore->lit = seqStore->lit + uVar22;
          psVar8 = seqStore->sequences;
          puVar20 = local_98;
          puVar24 = local_90;
          if (0xffff < uVar22) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar8 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar18 = *(ulong *)((long)src + 8);
          *puVar30 = *src;
          puVar30[1] = uVar18;
          pBVar16 = seqStore->lit;
          if (0x10 < uVar22) {
            uVar18 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar16 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar16 + 0x18) = uVar18;
            if (0x20 < (long)uVar22) {
              lVar12 = 0;
              do {
                puVar3 = (undefined8 *)((long)src + lVar12 + 0x20);
                uVar6 = puVar3[1];
                pBVar2 = pBVar16 + lVar12 + 0x20;
                *(undefined8 *)pBVar2 = *puVar3;
                *(undefined8 *)(pBVar2 + 8) = uVar6;
                puVar3 = (undefined8 *)((long)src + lVar12 + 0x30);
                uVar6 = puVar3[1];
                *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                *(undefined8 *)(pBVar2 + 0x18) = uVar6;
                lVar12 = lVar12 + 0x20;
              } while (pBVar2 + 0x20 < pBVar16 + uVar22);
            }
            goto LAB_01d31d3f;
          }
          seqStore->lit = pBVar16 + uVar22;
          psVar8 = seqStore->sequences;
        }
        psVar8->litLength = (U16)uVar22;
        psVar8->offBase = UVar25;
        if (0xffff < local_68 - 3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar8 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar8->mlBase = (U16)(local_68 - 3);
        seqStore->sequences = psVar8 + 1;
        if (ms->lazySkipping != 0) {
          uVar21 = ms->nextToUpdate;
          uVar18 = (ulong)uVar21;
          uVar9 = ((int)local_78 - (int)(local_88 + uVar18)) + 1;
          if (7 < uVar9) {
            uVar9 = 8;
          }
          if (local_78 < local_88 + uVar18) {
            uVar9 = 0;
          }
          if (uVar21 < uVar9 + uVar21) {
            UVar25 = ms->rowHashLog;
            uVar22 = ms->hashSalt;
            local_54 = 0x18 - UVar25;
            do {
              if (local_7c == 5) {
                uVar27 = *(long *)(local_88 + uVar18) * -0x30e4432345000000;
LAB_01d31ecf:
                UVar26 = (U32)((uVar27 ^ uVar22) >> (0x38U - (char)UVar25 & 0x3f));
              }
              else {
                if (local_7c == 6) {
                  uVar27 = *(long *)(local_88 + uVar18) * -0x30e4432340650000;
                  goto LAB_01d31ecf;
                }
                UVar26 = (*(int *)(local_88 + uVar18) * -0x61c8864f ^ (uint)uVar22) >>
                         ((byte)local_54 & 0x1f);
              }
              ms->hashCache[(uint)uVar18 & 7] = UVar26;
              uVar18 = uVar18 + 1;
            } while (uVar9 + uVar21 != uVar18);
          }
          ms->lazySkipping = 0;
          puVar20 = local_98;
          puVar24 = local_90;
        }
        src = (void *)((long)puVar15 + local_68);
        puVar15 = (ulong *)src;
        if ((uVar7 != 0) && (src <= local_78)) {
          uVar18 = (ulong)uVar7;
          while( true ) {
            uVar22 = uVar18;
            uVar18 = uVar29;
            uVar21 = (uint)uVar18;
            uVar29 = uVar18;
            puVar15 = (ulong *)src;
            uVar7 = (uint)uVar22;
            if ((int)*src != *(int *)((long)src - uVar22)) break;
            lVar12 = -uVar22;
            puVar15 = (ulong *)((long)src + 4);
            puVar11 = (ulong *)((long)src + lVar12 + 4);
            puVar30 = puVar15;
            if (puVar15 < puVar1) {
              if (*puVar11 == *puVar15) {
                lVar17 = 0;
                do {
                  puVar30 = (ulong *)((long)src + lVar17 + 0xc);
                  puVar20 = local_98;
                  if (puVar1 <= puVar30) {
                    puVar11 = (ulong *)((long)src + lVar12 + lVar17 + 0xc);
                    puVar30 = (ulong *)((long)src + lVar17 + 0xc);
                    goto LAB_01d32020;
                  }
                  uVar29 = *(ulong *)((long)src + lVar17 + lVar12 + 0xc);
                  uVar27 = *puVar30;
                  lVar17 = lVar17 + 8;
                } while (uVar29 == uVar27);
                uVar27 = uVar27 ^ uVar29;
                uVar29 = 0;
                if (uVar27 != 0) {
                  for (; (uVar27 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                  }
                }
                uVar29 = (uVar29 >> 3 & 0x1fffffff) + lVar17;
              }
              else {
                uVar27 = *puVar15 ^ *puVar11;
                uVar29 = 0;
                if (uVar27 != 0) {
                  for (; (uVar27 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                  }
                }
                uVar29 = uVar29 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_01d32020:
              if ((puVar30 < local_38) && ((int)*puVar11 == (int)*puVar30)) {
                puVar30 = (ulong *)((long)puVar30 + 4);
                puVar11 = (ulong *)((long)puVar11 + 4);
              }
              if ((puVar30 < local_40) && ((short)*puVar11 == (short)*puVar30)) {
                puVar30 = (ulong *)((long)puVar30 + 2);
                puVar11 = (ulong *)((long)puVar11 + 2);
              }
              if (puVar30 < puVar24) {
                puVar30 = (ulong *)((long)puVar30 + (ulong)((char)*puVar11 == (char)*puVar30));
              }
              uVar29 = (long)puVar30 - (long)puVar15;
            }
            puVar15 = (ulong *)seqStore->lit;
            if (puVar20 < src) {
              ZSTD_safecopyLiterals((BYTE *)puVar15,(BYTE *)src,(BYTE *)src,(BYTE *)puVar20);
              puVar20 = local_98;
              puVar24 = local_90;
            }
            else {
              uVar27 = *(ulong *)((long)src + 8);
              *puVar15 = *src;
              puVar15[1] = uVar27;
            }
            psVar8 = seqStore->sequences;
            psVar8->litLength = 0;
            psVar8->offBase = 1;
            if (0xffff < uVar29 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar8 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar8->mlBase = (U16)(uVar29 + 1);
            seqStore->sequences = psVar8 + 1;
            src = (void *)((long)src + uVar29 + 4);
            uVar29 = uVar22;
            puVar15 = (ulong *)src;
            uVar7 = uVar21;
            if ((uVar21 == 0) || (local_78 < src)) break;
          }
        }
      }
      uVar9 = (uint)uVar29;
    } while (puVar15 < local_78);
  }
  if (local_60 <= local_58) {
    local_60 = 0;
  }
  uVar13 = local_60;
  if (uVar9 != 0) {
    uVar13 = local_5c;
  }
  if (local_5c <= local_58) {
    uVar13 = local_60;
    local_5c = 0;
  }
  if (uVar9 != 0) {
    local_5c = uVar9;
  }
  if (uVar7 != 0) {
    uVar13 = uVar7;
  }
  *local_50 = local_5c;
  local_50[1] = uVar13;
  return (long)puVar24 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 0, ZSTD_noDict);
}